

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void Benchmark::fill_vector(double *x,double *y,unsigned_long n)

{
  size_t sVar1;
  result_type_conflict rVar2;
  undefined1 local_13b8 [8];
  uniform_real_distribution<double> dist;
  mt19937 e2;
  unsigned_long n_local;
  double *y_local;
  double *x_local;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&dist._M_param._M_b);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_13b8,1.0,151.0);
  e2._M_p = n;
  while (sVar1 = e2._M_p - 1, e2._M_p != 0) {
    rVar2 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_13b8,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dist._M_param._M_b);
    x[sVar1] = rVar2;
    rVar2 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_13b8,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dist._M_param._M_b);
    y[sVar1] = rVar2;
    e2._M_p = sVar1;
  }
  return;
}

Assistant:

void
Benchmark::fill_vector(double *x, double *y, unsigned long n)
{
	std::mt19937 e2;
	std::uniform_real_distribution<> dist(1, 151);

	while (n--)
	{
		x[n] = dist(e2);
		y[n] = dist(e2);
	}
}